

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.h
# Opt level: O3

void __thiscall
uWS::WebSocket<true,_true>::end(WebSocket<true,_true> *this,int code,string_view message)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ushort uVar3;
  undefined8 *puVar4;
  bool bVar5;
  long lVar6;
  ssize_t sVar7;
  LoopData *pLVar8;
  undefined8 uVar9;
  long lVar10;
  char *__src;
  ulong uVar11;
  int __fd;
  size_t __n;
  char closePayload [125];
  ushort local_b8;
  undefined1 local_b6 [134];
  
  __src = message._M_str;
  uVar11 = message._M_len;
  uVar3 = (ushort)code;
  lVar6 = us_socket_ext(1,this);
  if (*(char *)(lVar6 + 0x5c) == '\0') {
    *(undefined1 *)(lVar6 + 0x5c) = 1;
    __n = 0x7b;
    if (uVar11 < 0x7b) {
      __n = uVar11;
    }
    if (uVar3 == 0) {
      __fd = 0;
    }
    else {
      local_b8 = uVar3 << 8 | uVar3 >> 8;
      if (__src != (char *)0x0) {
        memcpy(local_b6,__src,__n);
      }
      __fd = (int)__n + 2;
    }
    sVar7 = send(this,__fd,&local_b8,8,0);
    pLVar8 = AsyncSocket<true>::getLoopData((AsyncSocket<true> *)this);
    if (((char)sVar7 != '\0') && ((WebSocket<true,_true> *)pLVar8->corkedSocket != this)) {
      us_socket_shutdown(1,this);
    }
    uVar9 = us_socket_context(1,this);
    lVar10 = us_socket_context_ext(1,uVar9);
    bVar5 = fu2::abi_400::detail::type_erasure::tables::
            vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>_>
            ::empty((vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>_>
                     *)(lVar10 + 0x50));
    if (!bVar5) {
      (**(code **)(lVar10 + 0x58))(lVar10 + 0x40,0x10,this,code,uVar11,__src);
    }
    TopicTree::unsubscribeAll((TopicTree *)(lVar10 + 0xb8),*(Subscriber **)(lVar6 + 0x68));
    puVar1 = *(undefined8 **)(lVar6 + 0x68);
    if (puVar1 != (undefined8 *)0x0) {
      puVar4 = (undefined8 *)*puVar1;
      while (puVar4 != puVar1) {
        puVar2 = (undefined8 *)*puVar4;
        operator_delete(puVar4,0x18);
        puVar4 = puVar2;
      }
    }
    operator_delete(puVar1,0x20);
    *(undefined8 *)(lVar6 + 0x68) = 0;
  }
  return;
}

Assistant:

void end(int code, std::string_view message = {}) {
        /* Check if we already called this one */
        WebSocketData *webSocketData = (WebSocketData *) us_socket_ext(SSL, (us_socket_t *) this);
        if (webSocketData->isShuttingDown) {
            return;
        }

        /* We postpone any FIN sending to either drainage or uncorking */
        webSocketData->isShuttingDown = true;

        /* Format and send the close frame */
        static const int MAX_CLOSE_PAYLOAD = 123;
        int length = (int) std::min<size_t>(MAX_CLOSE_PAYLOAD, message.length());
        char closePayload[MAX_CLOSE_PAYLOAD + 2];
        int closePayloadLength = (int) protocol::formatClosePayload(closePayload, (uint16_t) code, message.data(), length);
        bool ok = send(std::string_view(closePayload, closePayloadLength), OpCode::CLOSE);

        /* FIN if we are ok and not corked */
        WebSocket<SSL, true> *webSocket = (WebSocket<SSL, true> *) this;
        if (!webSocket->isCorked()) {
            if (ok) {
                /* If we are not corked, and we just sent off everything, we need to FIN right here.
                 * In all other cases, we need to fin either if uncork was successful, or when drainage is complete. */
                webSocket->shutdown();
            }
        }

        /* Emit close event */
        WebSocketContextData<SSL> *webSocketContextData = (WebSocketContextData<SSL> *) us_socket_context_ext(SSL,
            (us_socket_context_t *) us_socket_context(SSL, (us_socket_t *) this)
        );
        if (webSocketContextData->closeHandler) {
            webSocketContextData->closeHandler(this, code, message);
        }

        /* Make sure to unsubscribe from any pub/sub node at exit */
        webSocketContextData->topicTree.unsubscribeAll(webSocketData->subscriber);
        delete webSocketData->subscriber;
        webSocketData->subscriber = nullptr;
    }